

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImGuiContext *pIVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 in_register_00001204 [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar27 [64];
  float fVar28;
  float fVar29;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  
  pIVar11 = GImGui;
  auVar27._4_60_ = in_register_00001244;
  auVar27._0_4_ = v_max;
  auVar23._4_60_ = in_register_00001204;
  auVar23._0_4_ = v_min;
  uVar14 = flags & 0x100000;
  uVar13 = data_type & 0xfffffffe;
  fVar22 = *(float *)((long)&(bb->Min).x + (ulong)(uVar14 >> 0x12));
  fVar1 = *(float *)((long)&(bb->Max).x + (ulong)(uVar14 >> 0x12));
  fVar4 = (fVar1 - fVar22) + -4.0;
  fVar2 = (GImGui->Style).GrabMinSize;
  uVar7 = vcmpss_avx512f(auVar23._0_16_,auVar27._0_16_,1);
  bVar16 = (bool)((byte)uVar7 & 1);
  fVar17 = (float)((uint)bVar16 * (int)(v_max - v_min) + (uint)!bVar16 * (int)(v_min - v_max));
  fVar28 = fVar4 / (fVar17 + 1.0);
  uVar7 = vcmpps_avx512vl(ZEXT416((uint)fVar2),ZEXT416((uint)fVar28),2);
  auVar18 = ZEXT816(0) << 0x40;
  uVar6 = vcmpps_avx512vl(auVar18,ZEXT416((uint)fVar17),2);
  bVar8 = (byte)uVar6 & (byte)uVar7;
  auVar5 = vminss_avx(ZEXT416((uint)(bVar8 & 1) *
                              ((uint)(uVar13 != 8) * (int)fVar28 + (uint)(uVar13 == 8) * (int)fVar2)
                              + (uint)!(bool)(bVar8 & 1) * (int)fVar2),ZEXT416((uint)fVar4));
  fVar2 = fVar4 - auVar5._0_4_;
  fVar28 = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar13 == 8) {
      iVar12 = ImParseFormatPrecision(format,3);
      fVar28 = (float)iVar12;
    }
    else {
      fVar28 = 1.0;
    }
    fVar28 = powf(0.1,fVar28);
    auVar18 = vmaxss_avx(ZEXT416((uint)fVar2),ZEXT416(0x3f800000));
    auVar18 = ZEXT416((uint)(((pIVar11->Style).LogSliderDeadzone * 0.5) / auVar18._0_4_));
  }
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 + 2.0)),auVar5,SUB6416(ZEXT464(0x3f000000),0));
  fVar29 = auVar19._0_4_;
  fVar22 = auVar18._0_4_;
  if (pIVar11->ActiveId != id) {
    bVar16 = false;
    goto LAB_0030420b;
  }
  if (pIVar11->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar11->ActiveIdIsJustActivated == true) {
      pIVar11->SliderCurrentAccum = 0.0;
      pIVar11->SliderCurrentAccumDirty = false;
    }
    auVar24._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    auVar24._8_56_ = extraout_var_01;
    auVar18 = vmovshdup_avx(auVar24._0_16_);
    auVar19._8_4_ = 0x80000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar19._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(auVar18,auVar19);
    auVar18._0_4_ =
         (float)((uint)(uVar14 == 0) * (int)auVar24._0_4_ + (uint)(uVar14 != 0) * auVar18._0_4_);
    if ((auVar18._0_4_ != 0.0) || (NAN(auVar18._0_4_))) {
      if (uVar13 == 8) {
        iVar12 = ImParseFormatPrecision(format,3);
        if (iVar12 < 1) goto LAB_00303f09;
        uVar7 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
        bVar16 = (bool)((byte)uVar7 & 1);
        fVar17 = (float)((uint)bVar16 * (int)((auVar18._0_4_ / 100.0) / 10.0) +
                        (uint)!bVar16 * (int)(auVar18._0_4_ / 100.0));
      }
      else {
LAB_00303f09:
        auVar10._8_4_ = 0x7fffffff;
        auVar10._0_8_ = 0x7fffffff7fffffff;
        auVar10._12_4_ = 0x7fffffff;
        auVar19 = vandps_avx512vl(ZEXT416((uint)fVar17),auVar10);
        if ((auVar19._0_4_ <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          uVar7 = vcmpss_avx512f(auVar18,ZEXT816(0) << 0x40,1);
          bVar16 = (bool)((byte)uVar7 & 1);
          fVar17 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * 0x3f800000) / fVar17;
        }
        else {
          fVar17 = auVar18._0_4_ / 100.0;
        }
      }
      uVar7 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
      bVar16 = (bool)((byte)uVar7 & 1);
      pIVar11->SliderCurrentAccum =
           (float)((uint)bVar16 * (int)(fVar17 * 10.0) + (uint)!bVar16 * (int)fVar17) +
           pIVar11->SliderCurrentAccum;
      pIVar11->SliderCurrentAccumDirty = true;
    }
    fVar2 = pIVar11->SliderCurrentAccum;
    if ((pIVar11->NavActivatePressedId == id) && (pIVar11->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if (pIVar11->SliderCurrentAccumDirty == true) {
      bVar16 = SUB41((flags & 0x20U) >> 5,0);
      fVar20 = ScaleRatioFromValueT<float,float,float>
                         (data_type,*v,v_min,v_max,bVar16,fVar28,fVar22);
      fVar17 = fVar20;
      if ((fVar20 < 1.0) || (fVar2 <= 0.0)) {
        fVar21 = 0.0;
        if ((0.0 < fVar20) || (0.0 <= fVar2)) {
          auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar2 + fVar20)));
          uVar7 = vcmpss_avx512f(ZEXT416((uint)(fVar2 + fVar20)),ZEXT816(0),1);
          fVar17 = (float)((uint)!(bool)((byte)uVar7 & 1) * auVar18._0_4_);
          fVar21 = ScaleValueFromRatioT<float,float,float>
                             (data_type,fVar17,v_min,v_max,bVar16,fVar28,fVar22);
          if ((flags & 0x40U) == 0) {
            fVar21 = RoundScalarWithFormatT<float,float>(format,data_type,fVar21);
          }
          fVar21 = ScaleRatioFromValueT<float,float,float>
                             (data_type,fVar21,v_min,v_max,bVar16,fVar28,fVar22);
          fVar21 = fVar21 - fVar20;
          if (fVar2 <= 0.0) {
            uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar21),2);
            bVar16 = (bool)((byte)uVar7 & 1);
            fVar21 = (float)((uint)bVar16 * (int)fVar21 + (uint)!bVar16 * (int)fVar2);
          }
          else {
            auVar18 = vminss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar2));
            fVar21 = auVar18._0_4_;
          }
          fVar21 = pIVar11->SliderCurrentAccum - fVar21;
          bVar16 = true;
        }
        else {
          bVar16 = false;
        }
      }
      else {
        bVar16 = false;
        fVar21 = 0.0;
      }
      pIVar11->SliderCurrentAccum = fVar21;
      pIVar11->SliderCurrentAccumDirty = false;
      goto LAB_0030418c;
    }
    fVar17 = 0.0;
    bVar16 = false;
  }
  else {
    fVar17 = 0.0;
    if (pIVar11->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar11->IO).MouseDown[0] == false) {
        ClearActiveID();
        fVar17 = 0.0;
        bVar16 = false;
      }
      else {
        fVar17 = 0.0;
        if (0.0 < fVar2) {
          auVar19 = ZEXT416((uint)((*(float *)((pIVar11->IO).MouseDown +
                                              (ulong)(uVar14 >> 0x14) * 4 + -8) - fVar29) / fVar2));
          auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19);
          uVar7 = vcmpss_avx512f(auVar19,ZEXT816(0),1);
          fVar17 = (float)((uint)!(bool)((byte)uVar7 & 1) * auVar18._0_4_);
        }
        fVar17 = (float)((uint)(uVar14 == 0) * (int)fVar17 +
                        (uint)(uVar14 != 0) * (int)(1.0 - fVar17));
        bVar16 = true;
      }
    }
    else {
      bVar16 = false;
    }
  }
LAB_0030418c:
  if (bVar16) {
    auVar25._0_4_ =
         ScaleValueFromRatioT<float,float,float>
                   (data_type,fVar17,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar28,fVar22);
    auVar25._4_60_ = extraout_var;
    auVar18 = auVar25._0_16_;
    if ((flags & 0x40U) == 0) {
      auVar26._0_4_ = RoundScalarWithFormatT<float,float>(format,data_type,auVar25._0_4_);
      auVar26._4_60_ = extraout_var_00;
      auVar18 = auVar26._0_16_;
    }
    fVar2 = *v;
    fVar17 = auVar18._0_4_;
    if ((fVar2 != fVar17) || (NAN(fVar2) || NAN(fVar17))) {
      *v = fVar17;
      bVar16 = true;
    }
    else {
      uVar7 = vcmpss_avx512f(auVar18,ZEXT416((uint)fVar2),4);
      bVar16 = (bool)((byte)uVar7 & 1);
    }
  }
  else {
    bVar16 = false;
  }
LAB_0030420b:
  if (1.0 <= fVar4) {
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar19 = vxorps_avx512vl(auVar5,auVar9);
    auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar1 + -2.0)),auVar5,SUB6416(ZEXT464(0x3f000000),0));
    fVar22 = ScaleRatioFromValueT<float,float,float>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar28,fVar22);
    bVar15 = uVar14 == 0;
    auVar18 = vfmadd213ss_fma(ZEXT416((uint)(auVar18._0_4_ - fVar29)),
                              ZEXT416((uint)bVar15 * (int)fVar22 +
                                      (uint)!bVar15 * (int)(1.0 - fVar22)),ZEXT416((uint)fVar29));
    if (bVar15) {
      auVar19 = vfmadd213ss_fma(auVar19,SUB6416(ZEXT464(0x3f000000),0),auVar18);
      fVar22 = (bb->Min).y;
      fVar1 = (bb->Max).y;
      auVar5 = vfmadd213ss_fma(auVar5,SUB6416(ZEXT464(0x3f000000),0),auVar18);
      (out_grab_bb->Min).x = auVar19._0_4_;
      (out_grab_bb->Min).y = fVar22 + 2.0;
      (out_grab_bb->Max).x = auVar5._0_4_;
      (out_grab_bb->Max).y = fVar1 + -2.0;
    }
    else {
      fVar22 = (bb->Max).x;
      auVar19 = vfmadd213ss_fma(auVar19,SUB6416(ZEXT464(0x3f000000),0),auVar18);
      auVar5 = vfmadd213ss_fma(auVar5,SUB6416(ZEXT464(0x3f000000),0),auVar18);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar19._0_4_;
      (out_grab_bb->Max).x = fVar22 + -2.0;
      (out_grab_bb->Max).y = auVar5._0_4_;
    }
  }
  else {
    IVar3 = bb->Min;
    out_grab_bb->Min = IVar3;
    out_grab_bb->Max = IVar3;
  }
  return bVar16;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}